

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O3

Maybe<kj::Exception> * __thiscall
kj::runCatchingExceptions<kj::pumpWebSocketLoop(kj::WebSocket&,kj::WebSocket&)::__0>
          (Maybe<kj::Exception> *__return_storage_ptr__,kj *this,anon_class_8_1_3fcf6739 *func)

{
  Maybe<kj::Exception> *pMVar1;
  
  pMVar1 = (Maybe<kj::Exception> *)(**(code **)(*(long *)this + 0x18))(this);
  (__return_storage_ptr__->ptr).isSet = false;
  return pMVar1;
}

Assistant:

Maybe<Exception> runCatchingExceptions(Func&& func) {
  try {
    func();
    return kj::none;
  } catch (...) {
    return getCaughtExceptionAsKj();
  }
}